

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

TypedAttribute<Imath_3_2::Matrix33<float>_> *
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::cast(Attribute *attribute)

{
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar1;
  TypeExc *this;
  
  if (attribute == (Attribute *)0x0) {
    pTVar1 = (TypedAttribute<Imath_3_2::Matrix33<float>_> *)0x0;
  }
  else {
    pTVar1 = (TypedAttribute<Imath_3_2::Matrix33<float>_> *)
             __dynamic_cast(attribute,&Attribute::typeinfo,
                            &TypedAttribute<Imath_3_2::Matrix33<float>>::typeinfo,0);
  }
  if (pTVar1 != (TypedAttribute<Imath_3_2::Matrix33<float>_> *)0x0) {
    return pTVar1;
  }
  this = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::TypeExc::TypeExc(this,"Unexpected attribute type.");
  __cxa_throw(this,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
}

Assistant:

const TypedAttribute<T>*
TypedAttribute<T>::cast (const Attribute* attribute)
{
    const TypedAttribute<T>* t =
        dynamic_cast<const TypedAttribute<T>*> (attribute);

    if (t == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}